

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

double __thiscall
MADPComponentFactoredStates::GetInitialStateProbability(MADPComponentFactoredStates *this,Index sI)

{
  double in_XMM0_Qa;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacValues;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GetInitialStateProbability(Index sI)","");
  AssureInitialized(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  IndexTools::JointToIndividualIndicesStepSize
            (&local_58,sI,this->_m_stepSize,this->_m_nrStateFactors);
  (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[8])
            (this->_m_initialStateDistribution,&local_58);
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return in_XMM0_Qa;
}

Assistant:

double MADPComponentFactoredStates::GetInitialStateProbability(Index sI) const
{
    AssureInitialized("GetInitialStateProbability(Index sI)"); 
    vector<Index> sfacValues = StateIndexToFactorValueIndices(sI);
    return(_m_initialStateDistribution->GetProbability(sfacValues) );
}